

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O0

SUNErrCode SUNQRAdd_DCGS2_SB(N_Vector *Q,sunrealtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  int in_ECX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  N_Vector in_R9;
  sunrealtype sVar1;
  SUNQRData qrdata;
  sunindextype j;
  SUNContext sunctx_local_scope_;
  N_Vector in_stack_ffffffffffffffb8;
  N_Vector p_Var2;
  N_Vector in_stack_ffffffffffffffc8;
  N_Vector *Y;
  
  Y = *(N_Vector **)(*in_RDI + 0x10);
  p_Var2 = in_R9;
  N_VScale((sunrealtype)in_R9,in_stack_ffffffffffffffb8,(N_Vector)0x10c2a6);
  if (0 < in_ECX) {
    if (in_ECX == 1) {
      N_VDotProdMulti((int)((ulong)Y >> 0x20),in_stack_ffffffffffffffc8,(N_Vector *)in_R9,
                      (sunrealtype *)in_stack_ffffffffffffffb8);
    }
    else if (1 < in_ECX) {
      N_VDotProdMultiLocal(in_ECX,p_Var2,Y,(sunrealtype *)in_stack_ffffffffffffffc8);
      N_VDotProdMultiLocal(in_ECX,p_Var2,Y,(sunrealtype *)in_stack_ffffffffffffffc8);
      N_VDotProdMultiAllReduce
                ((int)((ulong)Y >> 0x20),in_stack_ffffffffffffffc8,(sunrealtype *)in_R9);
      for (p_Var2 = (N_Vector)0x0; (long)p_Var2 < (long)in_ECX;
          p_Var2 = (N_Vector)((long)&p_Var2->content + 1)) {
        *(SUNProfiler *)(in_RSI + ((long)&p_Var2->content + (long)(in_ECX * in_R8D)) * 8) =
             (&in_R9->sunctx->profiler)[(long)p_Var2];
      }
      N_VLinearCombination
                ((int)((ulong)Y >> 0x20),(sunrealtype *)p_Var2,(N_Vector *)in_R9,
                 in_stack_ffffffffffffffb8);
      N_VLinearSum((sunrealtype)Y,p_Var2,(sunrealtype)in_R9,in_stack_ffffffffffffffb8,
                   (N_Vector)0x10c437);
      for (in_stack_ffffffffffffffc8 = (N_Vector)0x0;
          (long)in_stack_ffffffffffffffc8 < (long)(in_ECX + -1);
          in_stack_ffffffffffffffc8 = (N_Vector)((long)&in_stack_ffffffffffffffc8->content + 1)) {
        *(double *)
         (in_RSI + ((long)&in_stack_ffffffffffffffc8->content + (long)((in_ECX + -1) * in_R8D)) * 8)
             = *(double *)
                (in_RSI + ((long)&in_stack_ffffffffffffffc8->content +
                          (long)((in_ECX + -1) * in_R8D)) * 8) +
               (double)(&in_R9->sunctx->profiler)
                       [(long)&in_stack_ffffffffffffffc8->content + (long)in_ECX];
      }
    }
    N_VLinearCombination
              ((int)((ulong)Y >> 0x20),(sunrealtype *)in_stack_ffffffffffffffc8,(N_Vector *)in_R9,
               in_stack_ffffffffffffffb8);
    N_VLinearSum((sunrealtype)Y,in_stack_ffffffffffffffc8,(sunrealtype)in_R9,
                 in_stack_ffffffffffffffb8,(N_Vector)0x10c518);
  }
  sVar1 = N_VDotProd(in_R9,in_stack_ffffffffffffffb8);
  *(sunrealtype *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8) = sVar1;
  if (0.0 < *(double *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8)) {
    p_Var2 = (N_Vector)sqrt(*(double *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8));
  }
  else {
    p_Var2 = (N_Vector)0x0;
  }
  *(N_Vector *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8) = p_Var2;
  N_VScale((sunrealtype)in_R9,p_Var2,(N_Vector)0x10c5f0);
  return 0;
}

Assistant:

SUNErrCode SUNQRAdd_DCGS2_SB(N_Vector* Q, sunrealtype* R, N_Vector df, int m,
                             int mMax, void* QRdata)
{
  SUNFunctionBegin(Q[0]->sunctx);
  sunindextype j;
  SUNQRData qrdata = (SUNQRData)QRdata;

  N_VScale(ONE, df, qrdata->vtemp);
  SUNCheckLastErr(); /* temp = df */

  if (m > 0)
  {
    if (m == 1)
    {
      /* R(1:k-1,k) = Q_k-1^T df_aa */
      SUNCheckCall(N_VDotProdMulti(m, qrdata->vtemp, Q, R + m * mMax));
    }
    /* Delayed reorthogonalization */
    else if (m > 1)
    {
      /* R(1:k-1,k) = Q_k-1^T df_aa */
      /* Put R values at beginning of temp array */
      SUNCheckCall(N_VDotProdMultiLocal(m, qrdata->vtemp, Q, qrdata->temp_array));

      /* s = Q_k-2^T Q(:,k-1) */
      SUNCheckCall(
        N_VDotProdMultiLocal(m - 1, Q[m - 1], Q, qrdata->temp_array + m));
      SUNCheckCall(
        N_VDotProdMultiAllReduce(m + m - 1, qrdata->vtemp, qrdata->temp_array));

      /* Move R values to R */
      for (j = 0; j < m; j++) { R[m * mMax + j] = qrdata->temp_array[j]; }

      /* Q(:,k-1) = Q(:,k-1) - Q_k-2 s */
      SUNCheckCall(
        N_VLinearCombination(m - 1, qrdata->temp_array + m, Q, qrdata->vtemp2));
      N_VLinearSum(ONE, Q[m - 1], -ONE, qrdata->vtemp2, Q[m - 1]);
      SUNCheckLastErr();

      /* R(1:k-2,k-1) = R(1:k-2,k-1) + s */
      for (j = 0; j < m - 1; j++)
      {
        R[(m - 1) * mMax + j] = R[(m - 1) * mMax + j] + qrdata->temp_array[m + j];
      }
    }

    /* df = df - Q(:,k-1) R(1:k-1,k) */
    SUNCheckCall(N_VLinearCombination(m, R + m * mMax, Q, qrdata->vtemp2));
    N_VLinearSum(ONE, qrdata->vtemp, -ONE, qrdata->vtemp2, qrdata->vtemp);
    SUNCheckLastErr();
  }

  /* R(k,k) = \| df \| */
  R[m * mMax + m] = N_VDotProd(qrdata->vtemp, qrdata->vtemp);
  SUNCheckLastErr();
  R[m * mMax + m] = SUNRsqrt(R[m * mMax + m]);
  /* Q(:,k) = df / R(k,k) */
  N_VScale((1 / R[m * mMax + m]), qrdata->vtemp, Q[m]);
  SUNCheckLastErr();

  return SUN_SUCCESS;
}